

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O1

CMAC_ACPKM_CTX * CMAC_ACPKM_CTX_new(void)

{
  CMAC_ACPKM_CTX *ptr;
  EVP_CIPHER_CTX *pEVar1;
  
  ptr = (CMAC_ACPKM_CTX *)
        CRYPTO_zalloc(0x90,
                      "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_omac_acpkm.c"
                      ,0x3d);
  if (ptr != (CMAC_ACPKM_CTX *)0x0) {
    pEVar1 = EVP_CIPHER_CTX_new();
    ptr->cctx = (EVP_CIPHER_CTX *)pEVar1;
    if (pEVar1 != (EVP_CIPHER_CTX *)0x0) {
      pEVar1 = EVP_CIPHER_CTX_new();
      ptr->actx = (EVP_CIPHER_CTX *)pEVar1;
      if (pEVar1 != (EVP_CIPHER_CTX *)0x0) {
        ptr->nlast_block = -1;
        ptr->section_size = 0x1000;
        ptr->num = 0;
        return ptr;
      }
      EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)ptr->cctx);
    }
    CRYPTO_free(ptr);
  }
  return (CMAC_ACPKM_CTX *)0x0;
}

Assistant:

static CMAC_ACPKM_CTX *CMAC_ACPKM_CTX_new(void)
{
    CMAC_ACPKM_CTX *ctx;
    ctx = OPENSSL_zalloc(sizeof(CMAC_ACPKM_CTX));
    if (!ctx)
        return NULL;
    ctx->cctx = EVP_CIPHER_CTX_new();
    if (ctx->cctx == NULL) {
        OPENSSL_free(ctx);
        return NULL;
    }
    ctx->actx = EVP_CIPHER_CTX_new();
    if (ctx->actx == NULL) {
        EVP_CIPHER_CTX_free(ctx->cctx);
        OPENSSL_free(ctx);
        return NULL;
    }
    ctx->nlast_block = -1;
    ctx->num = 0;
    ctx->section_size = 4096; /* recommended value for Kuznyechik */
    return ctx;
}